

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcard_mt.cpp
# Opt level: O3

void __thiscall
xcardMT::runnerLS(xcardMT *this,longlong start,longlong end,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *result)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  undefined8 uVar5;
  ulong uVar6;
  uint __len;
  ulong __val;
  string card;
  string __str_1;
  string local_78;
  ulong local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = end;
  if (start < end) {
    do {
      __val = -start;
      if (0 < start) {
        __val = start;
      }
      __len = 1;
      if (9 < __val) {
        uVar6 = __val;
        uVar1 = 4;
        do {
          __len = uVar1;
          if (uVar6 < 100) {
            __len = __len - 2;
            goto LAB_00104fa8;
          }
          if (uVar6 < 1000) {
            __len = __len - 1;
            goto LAB_00104fa8;
          }
          if (uVar6 < 10000) goto LAB_00104fa8;
          bVar2 = 99999 < uVar6;
          uVar6 = uVar6 / 10000;
          uVar1 = __len + 4;
        } while (bVar2);
        __len = __len + 1;
      }
LAB_00104fa8:
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_78,(char)__len - (char)(start >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long_long>
                (local_78._M_dataplus._M_p + -(start >> 0x3f),__len,__val);
      bVar2 = xcard::LuhnCheck(&this->super_xcard,&local_78);
      if (bVar2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(result,&local_78);
        if ((this->super_xcard).debug != 0) {
          iVar3 = pthread_mutex_lock((pthread_mutex_t *)&mutex);
          if (iVar3 != 0) {
            uVar5 = std::__throw_system_error(iVar3);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p);
            }
            _Unwind_Resume(uVar5);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[VALID] ",8);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_78._M_dataplus._M_p,
                              local_78._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          pthread_mutex_unlock((pthread_mutex_t *)&mutex);
        }
      }
      else {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_50,'\x01');
        *local_50._M_dataplus._M_p = '0';
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result,
                   &local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      start = start + 1;
    } while (start != local_58);
  }
  return;
}

Assistant:

void xcardMT::runnerLS(long long int start, long long int end, std::vector<std::string> *result)
{

    int countdown = 10;

    for (long long int i = start; i < end; i++)
    {

        std::string card = std::to_string(i);

        if (LuhnCheck(card) == true)
        {
            result->push_back(card);
            if (this->debug){
                mutex.lock();
                std::cout << "[VALID] " << card << std::endl;
                mutex.unlock();
            }
        }
        else{
            result->push_back(std::to_string(false));
        }

        countdown--;

        if (countdown == 0)
        {
            //reset
            countdown = 10;
        }
    }
}